

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::set_optional<std::__cxx11::string>
          (Parser *this,string *name,string *alternative,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue,
          string *description)

{
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50 [3];
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *command;
  string *description_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue_local;
  string *alternative_local;
  string *name_local;
  Parser *this_local;
  
  command = (CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)description;
  description_local = defaultValue;
  defaultValue_local = alternative;
  alternative_local = name;
  name_local = &this->_appname;
  this_00 = (CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(200);
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CmdArgument(this_00,alternative_local,defaultValue_local,(string *)command,false);
  local_38 = this_00;
  std::__cxx11::string::operator=((string *)&this_00->value,(string *)defaultValue);
  local_50[0] = local_38;
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::push_back
            (&this->_commands,(value_type *)local_50);
  return;
}

Assistant:

void set_optional(const std::string& name, const std::string& alternative, T defaultValue, const std::string& description = "") {
			auto command = new CmdArgument<T> { name, alternative, description, false };
			command->value = defaultValue;
			_commands.push_back(command);
		}